

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O3

void __thiscall
bssl::HPKETest_SetupRecipientWrongLengthEnc_Test::TestBody
          (HPKETest_SetupRecipientWrongLengthEnc_Test *this)

{
  int iVar1;
  EVP_HPKE_KEM *kem;
  EVP_HPKE_KDF *kdf;
  EVP_HPKE_AEAD *aead;
  ulong uVar2;
  char *in_R9;
  char *expected_predicate_value;
  pointer *__ptr;
  uint8_t bogus_enc [37];
  ScopedEVP_HPKE_KEY key;
  ScopedEVP_HPKE_CTX recipient_ctx;
  AssertHelper local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3b0;
  AssertHelper local_3a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_3a0;
  string local_398;
  undefined8 local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_370;
  undefined8 local_368;
  undefined5 uStack_360;
  undefined3 uStack_35b;
  undefined5 uStack_358;
  EVP_HPKE_KEY local_348;
  undefined1 local_2d8 [16];
  EVP_HPKE_KEM local_2c8 [7];
  
  EVP_HPKE_KEY_zero(&local_348);
  kem = EVP_hpke_x25519_hkdf_sha256();
  iVar1 = EVP_HPKE_KEY_generate(&local_348,kem);
  local_378 = CONCAT71(local_378._1_7_,iVar1 != 0);
  pbStack_370 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&local_398);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2d8,(internal *)&local_378,
               (AssertionResult *)"EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256())",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x262,(char *)local_2d8._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if ((EVP_HPKE_KEM *)local_2d8._0_8_ != local_2c8) {
      operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8[0]._0_8_ + 1));
    }
    if ((long *)local_398._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_398._M_dataplus._M_p + 8))();
    }
    if (pbStack_370 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_370,pbStack_370);
    }
  }
  else {
    pbStack_370 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_368 = 0;
    uStack_360 = 0;
    uStack_35b = 0;
    uStack_358 = 0;
    local_378 = 0xff;
    EVP_HPKE_CTX_zero((EVP_HPKE_CTX *)local_2d8);
    kdf = EVP_hpke_hkdf_sha256();
    aead = EVP_hpke_aes_128_gcm();
    expected_predicate_value = (char *)0x25;
    iVar1 = EVP_HPKE_CTX_setup_recipient
                      ((EVP_HPKE_CTX *)local_2d8,&local_348,kdf,aead,(uint8_t *)&local_378,0x25,
                       (uint8_t *)0x0,0);
    local_3b8.data_._0_1_ = (internal)(iVar1 == 0);
    local_3b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_3b8.data_._0_1_) {
      uVar2 = ERR_get_error();
      ErrorEquals((uint32_t)&local_3b8,(int)uVar2,6);
      if (local_3b8.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_3a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_398,(internal *)&local_3b8,
                   (AssertionResult *)"ErrorEquals(ERR_get_error(), ERR_LIB_EVP, 134)","false",
                   "true",expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                   ,0x26b,local_398._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3a0);
        testing::internal::AssertHelper::~AssertHelper(&local_3a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p != &local_398.field_2) {
          operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
        }
        if (local_3a0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_3a0._M_head_impl + 8))();
        }
      }
      if (local_3b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_3b0,local_3b0);
      }
      ERR_clear_error();
    }
    else {
      testing::Message::Message((Message *)&local_3a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_398,(internal *)&local_3b8,
                 (AssertionResult *)
                 "EVP_HPKE_CTX_setup_recipient( recipient_ctx.get(), key.get(), EVP_hpke_hkdf_sha256(), EVP_hpke_aes_128_gcm(), bogus_enc, sizeof(bogus_enc), nullptr, 0)"
                 ,"true","false",expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                (&local_3a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                 ,0x269,local_398._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3a0);
      testing::internal::AssertHelper::~AssertHelper(&local_3a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != &local_398.field_2) {
        operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
      }
      if (local_3a0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_3a0._M_head_impl + 8))();
      }
      if (local_3b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_3b0,local_3b0);
      }
    }
    EVP_HPKE_CTX_cleanup((EVP_HPKE_CTX *)local_2d8);
  }
  EVP_HPKE_KEY_cleanup(&local_348);
  return;
}

Assistant:

TEST(HPKETest, SetupRecipientWrongLengthEnc) {
  ScopedEVP_HPKE_KEY key;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()));

  const uint8_t bogus_enc[X25519_PUBLIC_VALUE_LEN + 5] = {0xff};

  ScopedEVP_HPKE_CTX recipient_ctx;
  ASSERT_FALSE(EVP_HPKE_CTX_setup_recipient(
      recipient_ctx.get(), key.get(), EVP_hpke_hkdf_sha256(),
      EVP_hpke_aes_128_gcm(), bogus_enc, sizeof(bogus_enc), nullptr, 0));
  EXPECT_TRUE(
      ErrorEquals(ERR_get_error(), ERR_LIB_EVP, EVP_R_INVALID_PEER_KEY));
  ERR_clear_error();
}